

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O3

void __thiscall OpenMD::MatrixAccumulator::getStdDev(MatrixAccumulator *this,ResultType *ret)

{
  undefined8 *puVar1;
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  ResultType *pRVar4;
  uint j_1;
  undefined8 *puVar5;
  uint i_1;
  double dVar6;
  double dVar7;
  Mat3x3d var;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  puVar1 = &local_68;
  puVar5 = &local_68;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_28 = 0;
  pRVar4 = &this->Avg2_;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      dVar6 = pRVar4[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar3];
      dVar7 = (pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar3] - dVar6 * dVar6;
      dVar6 = 0.0;
      if (0.0 <= dVar7) {
        dVar6 = dVar7;
      }
      *(double *)((long)puVar1 + lVar3 * 8) = dVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 0x18);
    pRVar4 = (ResultType *)
             ((pRVar4->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      dVar6 = *(double *)((long)puVar5 + lVar3 * 8);
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      (((SquareMatrix<double,_3> *)*(double (*) [3])ret)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar3] = dVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    puVar5 = (undefined8 *)((long)puVar5 + 0x18);
    ret = (ResultType *)((long)ret + 0x18);
  } while (lVar2 != 3);
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      Mat3x3d var;
      this->getVariance(var);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = sqrt(var(i, j));
        }
      }
      return;
    }